

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish_x86.cpp
# Opt level: O0

int __thiscall ncnn::Swish_x86::forward_inplace(Swish_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float *pfVar12;
  long in_RSI;
  int iVar13;
  double dVar14;
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  __m128 _p_1;
  int i_1;
  float *ptr_1;
  int q_1;
  __m128 _p;
  int i;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int h;
  int w;
  __m128 one;
  __m128 one_2;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf z_1;
  v4sf mask_1;
  v4sf one_3;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_1;
  v4sf pow2n;
  v4sf y;
  v4sf z;
  v4sf mask;
  v4sf one_1;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  float *in_stack_fffffffffffff400;
  Mat *in_stack_fffffffffffff408;
  int local_be4;
  Mat local_be0;
  float *local_b98;
  int local_b8c;
  undefined8 local_b88;
  undefined8 uStack_b80;
  int local_b70;
  Mat local_b60;
  float *local_b18;
  int local_b10;
  int local_b0c;
  int local_b08;
  int local_b04;
  int local_b00;
  int local_afc;
  float *local_ad8;
  float *local_ad0;
  float local_ac8;
  float fStack_ac4;
  float fStack_ac0;
  float fStack_abc;
  float *local_ab0;
  float local_aa8;
  float fStack_aa4;
  float fStack_aa0;
  float fStack_a9c;
  float *local_a90;
  Mat *local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined1 local_a68 [8];
  float fStack_a60;
  float fStack_a5c;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined1 local_a48 [8];
  float fStack_a40;
  float fStack_a3c;
  Mat *local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  Mat *local_9f8;
  undefined8 uStack_9f0;
  undefined4 local_9e8;
  undefined4 uStack_9e4;
  undefined4 uStack_9e0;
  undefined4 uStack_9dc;
  undefined4 local_9cc;
  undefined4 local_9c8;
  undefined4 uStack_9c4;
  undefined4 uStack_9c0;
  undefined4 uStack_9bc;
  undefined4 local_9ac;
  float local_9a8;
  float fStack_9a4;
  float fStack_9a0;
  float fStack_99c;
  undefined8 local_998;
  undefined8 uStack_990;
  float local_988;
  float fStack_984;
  float fStack_980;
  float fStack_97c;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  float local_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  float local_5e8;
  float fStack_5e4;
  float fStack_5e0;
  float fStack_5dc;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  ulong local_d8;
  ulong uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  ulong local_b8;
  ulong uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_afc = *(int *)(in_RSI + 0x2c);
  local_b00 = *(int *)(in_RSI + 0x30);
  local_b04 = *(int *)(in_RSI + 0x38);
  local_b08 = local_afc * local_b00;
  local_b0c = *(int *)(in_RSI + 0x18);
  if (local_b0c == 4) {
    local_b0c = 4;
    for (local_b10 = 0; local_b10 < local_b04; local_b10 = local_b10 + 1) {
      ncnn::Mat::channel(in_stack_fffffffffffff408,(int)((ulong)in_stack_fffffffffffff400 >> 0x20));
      in_stack_fffffffffffff400 = ncnn::Mat::operator_cast_to_float_(&local_b60);
      ncnn::Mat::~Mat((Mat *)0x902de9);
      local_b18 = in_stack_fffffffffffff400;
      for (local_b70 = 0; local_b70 < local_b08; local_b70 = local_b70 + 1) {
        local_ad0 = local_b18;
        local_b88 = *(undefined8 *)local_b18;
        uStack_b80 = *(undefined8 *)(local_b18 + 2);
        local_a90 = local_b18;
        local_9ac = 0x3f800000;
        local_9c8 = 0x3f800000;
        local_a28 = 0x3f8000003f800000;
        uStack_a20 = 0x3f8000003f800000;
        local_218 = 0;
        uStack_210 = 0;
        local_258 = 0;
        uStack_250 = 0;
        local_268._0_4_ = (float)local_b88;
        local_268._4_4_ = (float)((ulong)local_b88 >> 0x20);
        uStack_260._0_4_ = (float)uStack_b80;
        uStack_260._4_4_ = (float)((ulong)uStack_b80 >> 0x20);
        local_5b8 = CONCAT44(0.0 - local_268._4_4_,0.0 - (float)local_268);
        uStack_5b0._0_4_ = 0.0 - (float)uStack_260;
        uStack_5b0._4_4_ = 0.0 - uStack_260._4_4_;
        local_248 = 0;
        uStack_240 = 0;
        local_5f8 = 0x3f8000003f800000;
        uStack_5f0 = 0x3f8000003f800000;
        local_1f8 = local_5b8;
        uStack_1f0 = uStack_5b0;
        local_208 = 0x42b0c0a542b0c0a5;
        uStack_200 = 0x42b0c0a542b0c0a5;
        auVar7._8_8_ = uStack_5b0;
        auVar7._0_8_ = local_5b8;
        auVar6._8_8_ = 0x42b0c0a542b0c0a5;
        auVar6._0_8_ = 0x42b0c0a542b0c0a5;
        auVar15 = minps(auVar7,auVar6);
        local_5b8 = auVar15._0_8_;
        local_1b8 = local_5b8;
        uStack_5b0 = auVar15._8_8_;
        uStack_1b0 = uStack_5b0;
        local_1c8 = 0xc2b0c0a5c2b0c0a5;
        uStack_1c0 = 0xc2b0c0a5c2b0c0a5;
        auVar10._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar10._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar15 = maxps(auVar15,auVar10);
        local_5b8 = auVar15._0_8_;
        uVar1 = local_5b8;
        uStack_5b0 = auVar15._8_8_;
        uVar2 = uStack_5b0;
        local_468 = 0x3fb8aa3b3fb8aa3b;
        uStack_460 = 0x3fb8aa3b3fb8aa3b;
        local_458._0_4_ = auVar15._0_4_;
        local_458._4_4_ = auVar15._4_4_;
        uStack_450._0_4_ = auVar15._8_4_;
        uStack_450._4_4_ = auVar15._12_4_;
        local_358 = CONCAT44(local_458._4_4_ * 1.442695,(float)local_458 * 1.442695);
        uStack_350 = CONCAT44(uStack_450._4_4_ * 1.442695,(float)uStack_450 * 1.442695);
        local_408 = 0x3f0000003f000000;
        uStack_400 = 0x3f0000003f000000;
        fVar16 = (float)local_458 * 1.442695 + 0.5;
        fVar17 = local_458._4_4_ * 1.442695 + 0.5;
        fVar18 = (float)uStack_450 * 1.442695 + 0.5;
        fVar19 = uStack_450._4_4_ * 1.442695 + 0.5;
        local_178 = CONCAT44(fVar17,fVar16);
        uStack_170 = CONCAT44(fVar19,fVar18);
        local_148 = CONCAT44((int)fVar17,(int)fVar16);
        uStack_140 = CONCAT44((int)fVar19,(int)fVar18);
        local_5d8 = (float)(int)fVar16;
        fStack_5d4 = (float)(int)fVar17;
        fStack_5d0 = (float)(int)fVar18;
        fStack_5cc = (float)(int)fVar19;
        local_5c8 = CONCAT44(fStack_5d4,local_5d8);
        uStack_5c0 = CONCAT44(fStack_5cc,fStack_5d0);
        local_118 = local_5c8;
        uStack_110 = uStack_5c0;
        local_128 = CONCAT44(fVar17,fVar16);
        uStack_120 = CONCAT44(fVar19,fVar18);
        local_608 = CONCAT44(-(uint)(fVar17 < fStack_5d4),-(uint)(fVar16 < local_5d8));
        uStack_600 = CONCAT44(-(uint)(fVar19 < fStack_5cc),-(uint)(fVar18 < fStack_5d0));
        local_d8 = local_608;
        uStack_d0 = uStack_600;
        local_e8 = 0x3f8000003f800000;
        uStack_e0 = 0x3f8000003f800000;
        local_608 = local_608 & 0x3f8000003f800000;
        uStack_600 = uStack_600 & 0x3f8000003f800000;
        local_2f8 = local_5c8;
        uStack_2f0 = uStack_5c0;
        local_308._0_4_ = (float)local_608;
        local_308._4_4_ = (float)(local_608 >> 0x20);
        uStack_300._0_4_ = (float)uStack_600;
        uStack_300._4_4_ = (float)(uStack_600 >> 0x20);
        local_5d8 = local_5d8 - (float)local_308;
        fStack_5d4 = fStack_5d4 - local_308._4_4_;
        fStack_5d0 = fStack_5d0 - (float)uStack_300;
        fStack_5cc = fStack_5cc - uStack_300._4_4_;
        local_478 = CONCAT44(fStack_5d4,local_5d8);
        uStack_470 = CONCAT44(fStack_5cc,fStack_5d0);
        local_488 = 0x3f3180003f318000;
        uStack_480 = 0x3f3180003f318000;
        local_5c8 = CONCAT44(fStack_5d4 * 0.6933594,local_5d8 * 0.6933594);
        uStack_5c0 = CONCAT44(fStack_5cc * 0.6933594,fStack_5d0 * 0.6933594);
        local_498 = CONCAT44(fStack_5d4,local_5d8);
        uStack_490 = CONCAT44(fStack_5cc,fStack_5d0);
        local_4a8 = 0xb95e8083b95e8083;
        uStack_4a0 = 0xb95e8083b95e8083;
        local_318 = local_5b8;
        uStack_310 = uStack_5b0;
        local_328 = local_5c8;
        uStack_320 = uStack_5c0;
        local_458._0_4_ = (float)local_458 - local_5d8 * 0.6933594;
        local_458._4_4_ = local_458._4_4_ - fStack_5d4 * 0.6933594;
        uStack_450._0_4_ = (float)uStack_450 - fStack_5d0 * 0.6933594;
        uStack_450._4_4_ = uStack_450._4_4_ - fStack_5cc * 0.6933594;
        local_5b8 = CONCAT44(local_458._4_4_,(float)local_458);
        uStack_5b0._0_4_ = (float)uStack_450;
        uStack_5b0._4_4_ = uStack_450._4_4_;
        local_338 = local_5b8;
        uStack_330 = uStack_5b0;
        local_348 = CONCAT44(fStack_5d4 * -0.00021219444,local_5d8 * -0.00021219444);
        uStack_340 = CONCAT44(fStack_5cc * -0.00021219444,fStack_5d0 * -0.00021219444);
        local_458._0_4_ = (float)local_458 - local_5d8 * -0.00021219444;
        local_458._4_4_ = local_458._4_4_ - fStack_5d4 * -0.00021219444;
        uStack_450._0_4_ = (float)uStack_450 - fStack_5d0 * -0.00021219444;
        uStack_450._4_4_ = uStack_450._4_4_ - fStack_5cc * -0.00021219444;
        local_5b8 = CONCAT44(local_458._4_4_,(float)local_458);
        uStack_5b0._0_4_ = (float)uStack_450;
        uStack_5b0._4_4_ = uStack_450._4_4_;
        local_4c8 = local_5b8;
        uStack_4c0 = uStack_5b0;
        local_618 = (float)local_458 * (float)local_458;
        fStack_614 = local_458._4_4_ * local_458._4_4_;
        fStack_610 = (float)uStack_450 * (float)uStack_450;
        fStack_60c = uStack_450._4_4_ * uStack_450._4_4_;
        local_4d8 = 0x3950696739506967;
        uStack_4d0 = 0x3950696739506967;
        local_4e8 = local_5b8;
        uStack_4e0 = uStack_5b0;
        local_628 = CONCAT44(local_458._4_4_ * 0.00019875691,(float)local_458 * 0.00019875691);
        uStack_620 = CONCAT44(uStack_450._4_4_ * 0.00019875691,(float)uStack_450 * 0.00019875691);
        local_378 = local_628;
        uStack_370 = uStack_620;
        local_388 = 0x3ab743ce3ab743ce;
        uStack_380 = 0x3ab743ce3ab743ce;
        local_988 = (float)local_458 * 0.00019875691 + 0.0013981999;
        fStack_984 = local_458._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_980 = (float)uStack_450 * 0.00019875691 + 0.0013981999;
        fStack_97c = uStack_450._4_4_ * 0.00019875691 + 0.0013981999;
        local_628 = CONCAT44(fStack_984,local_988);
        uStack_620 = CONCAT44(fStack_97c,fStack_980);
        local_4f8 = local_628;
        uStack_4f0 = uStack_620;
        local_508 = local_5b8;
        uStack_500 = uStack_5b0;
        local_988 = local_988 * (float)local_458;
        fStack_984 = fStack_984 * local_458._4_4_;
        fStack_980 = fStack_980 * (float)uStack_450;
        fStack_97c = fStack_97c * uStack_450._4_4_;
        local_628 = CONCAT44(fStack_984,local_988);
        uStack_620 = CONCAT44(fStack_97c,fStack_980);
        local_398 = local_628;
        uStack_390 = uStack_620;
        local_3a8 = 0x3c0889083c088908;
        uStack_3a0 = 0x3c0889083c088908;
        local_988 = local_988 + 0.008333452;
        fStack_984 = fStack_984 + 0.008333452;
        fStack_980 = fStack_980 + 0.008333452;
        fStack_97c = fStack_97c + 0.008333452;
        local_628 = CONCAT44(fStack_984,local_988);
        uStack_620 = CONCAT44(fStack_97c,fStack_980);
        local_518 = local_628;
        uStack_510 = uStack_620;
        local_528 = local_5b8;
        uStack_520 = uStack_5b0;
        local_988 = local_988 * (float)local_458;
        fStack_984 = fStack_984 * local_458._4_4_;
        fStack_980 = fStack_980 * (float)uStack_450;
        fStack_97c = fStack_97c * uStack_450._4_4_;
        local_628 = CONCAT44(fStack_984,local_988);
        uStack_620 = CONCAT44(fStack_97c,fStack_980);
        local_3b8 = local_628;
        uStack_3b0 = uStack_620;
        local_3c8 = 0x3d2aa9c13d2aa9c1;
        uStack_3c0 = 0x3d2aa9c13d2aa9c1;
        local_988 = local_988 + 0.041665796;
        fStack_984 = fStack_984 + 0.041665796;
        fStack_980 = fStack_980 + 0.041665796;
        fStack_97c = fStack_97c + 0.041665796;
        local_628 = CONCAT44(fStack_984,local_988);
        uStack_620 = CONCAT44(fStack_97c,fStack_980);
        local_538 = local_628;
        uStack_530 = uStack_620;
        local_548 = local_5b8;
        uStack_540 = uStack_5b0;
        local_988 = local_988 * (float)local_458;
        fStack_984 = fStack_984 * local_458._4_4_;
        fStack_980 = fStack_980 * (float)uStack_450;
        fStack_97c = fStack_97c * uStack_450._4_4_;
        local_628 = CONCAT44(fStack_984,local_988);
        uStack_620 = CONCAT44(fStack_97c,fStack_980);
        local_3d8 = local_628;
        uStack_3d0 = uStack_620;
        local_3e8 = 0x3e2aaaaa3e2aaaaa;
        uStack_3e0 = 0x3e2aaaaa3e2aaaaa;
        local_988 = local_988 + 0.16666666;
        fStack_984 = fStack_984 + 0.16666666;
        fStack_980 = fStack_980 + 0.16666666;
        fStack_97c = fStack_97c + 0.16666666;
        local_628 = CONCAT44(fStack_984,local_988);
        uStack_620 = CONCAT44(fStack_97c,fStack_980);
        local_558 = local_628;
        uStack_550 = uStack_620;
        local_568 = local_5b8;
        uStack_560 = uStack_5b0;
        local_988 = local_988 * (float)local_458;
        fStack_984 = fStack_984 * local_458._4_4_;
        fStack_980 = fStack_980 * (float)uStack_450;
        fStack_97c = fStack_97c * uStack_450._4_4_;
        local_628 = CONCAT44(fStack_984,local_988);
        uStack_620 = CONCAT44(fStack_97c,fStack_980);
        local_3f8 = local_628;
        uStack_3f0 = uStack_620;
        local_988 = local_988 + 0.5;
        fStack_984 = fStack_984 + 0.5;
        fStack_980 = fStack_980 + 0.5;
        fStack_97c = fStack_97c + 0.5;
        local_628 = CONCAT44(fStack_984,local_988);
        uStack_620 = CONCAT44(fStack_97c,fStack_980);
        local_578 = local_628;
        uStack_570 = uStack_620;
        local_588 = CONCAT44(fStack_614,local_618);
        uStack_580 = CONCAT44(fStack_60c,fStack_610);
        local_988 = local_988 * local_618;
        fStack_984 = fStack_984 * fStack_614;
        fStack_980 = fStack_980 * fStack_610;
        fStack_97c = fStack_97c * fStack_60c;
        local_628 = CONCAT44(fStack_984,local_988);
        uStack_620 = CONCAT44(fStack_97c,fStack_980);
        local_418 = local_628;
        uStack_410 = uStack_620;
        local_428 = local_5b8;
        uStack_420 = uStack_5b0;
        local_988 = local_988 + (float)local_458;
        fStack_984 = fStack_984 + local_458._4_4_;
        fStack_980 = fStack_980 + (float)uStack_450;
        fStack_97c = fStack_97c + uStack_450._4_4_;
        local_628 = CONCAT44(fStack_984,local_988);
        uStack_620 = CONCAT44(fStack_97c,fStack_980);
        local_438 = local_628;
        uStack_430 = uStack_620;
        local_448 = 0x3f8000003f800000;
        uStack_440 = 0x3f8000003f800000;
        local_988 = local_988 + 1.0;
        fStack_984 = fStack_984 + 1.0;
        fStack_980 = fStack_980 + 1.0;
        fStack_97c = fStack_97c + 1.0;
        local_628 = CONCAT44(fStack_984,local_988);
        uStack_620 = CONCAT44(fStack_97c,fStack_980);
        local_188 = CONCAT44(fStack_5d4,local_5d8);
        uStack_180 = CONCAT44(fStack_5cc,fStack_5d0);
        local_98 = CONCAT44((int)fStack_5d4,(int)local_5d8);
        uStack_90 = CONCAT44((int)fStack_5cc,(int)fStack_5d0);
        local_a8 = 0x7f0000007f;
        uStack_a0 = 0x7f0000007f;
        iVar13 = (int)local_5d8 + 0x7f;
        fStack_5e4 = (float)((int)fStack_5d4 + 0x7f);
        fStack_5e0 = (float)((int)fStack_5d0 + 0x7f);
        fStack_5dc = (float)((int)fStack_5cc + 0x7f);
        local_58 = CONCAT44(fStack_5e4,iVar13);
        uStack_50 = CONCAT44(fStack_5dc,fStack_5e0);
        local_5c = 0x17;
        local_5e8 = (float)(iVar13 * 0x800000);
        local_638 = CONCAT44(fStack_5e4,local_5e8);
        uStack_630 = CONCAT44(fStack_5dc,fStack_5e0);
        local_598 = local_628;
        uStack_590 = uStack_620;
        local_988 = local_988 * local_5e8;
        fStack_984 = fStack_984 * fStack_5e4;
        fStack_980 = fStack_980 * fStack_5e0;
        fStack_97c = fStack_97c * fStack_5dc;
        local_628 = CONCAT44(fStack_984,local_988);
        uStack_620 = CONCAT44(fStack_97c,fStack_980);
        local_948 = local_628;
        uStack_940 = uStack_620;
        local_988 = local_988 + 1.0;
        fStack_984 = fStack_984 + 1.0;
        fStack_980 = fStack_980 + 1.0;
        fStack_97c = fStack_97c + 1.0;
        auVar5._8_8_ = 0x3f8000003f800000;
        auVar5._0_8_ = 0x3f8000003f800000;
        auVar4._4_4_ = fStack_984;
        auVar4._0_4_ = local_988;
        auVar4._8_4_ = fStack_980;
        auVar4._12_4_ = fStack_97c;
        _local_a68 = divps(auVar5,auVar4);
        local_aa8 = (float)local_268 * (float)local_a68._0_4_;
        fStack_aa4 = local_268._4_4_ * (float)local_a68._4_4_;
        fStack_aa0 = (float)uStack_260 * fStack_a60;
        fStack_a9c = uStack_260._4_4_ * fStack_a5c;
        *(ulong *)local_b18 = CONCAT44(fStack_aa4,local_aa8);
        *(ulong *)(local_b18 + 2) = CONCAT44(fStack_a9c,fStack_aa0);
        local_b18 = local_b18 + 4;
        local_a78 = local_b88;
        uStack_a70 = uStack_b80;
        local_a58 = local_b88;
        uStack_a50 = uStack_b80;
        local_a18 = local_b88;
        uStack_a10 = uStack_b80;
        uStack_9c4 = local_9c8;
        uStack_9c0 = local_9c8;
        uStack_9bc = local_9c8;
        local_978 = local_a28;
        uStack_970 = uStack_a20;
        local_938 = local_a28;
        uStack_930 = uStack_a20;
        local_5a8 = local_638;
        uStack_5a0 = uStack_630;
        local_4b8 = local_4c8;
        uStack_4b0 = uStack_4c0;
        local_458 = uVar1;
        uStack_450 = uVar2;
        local_368 = local_408;
        uStack_360 = uStack_400;
        local_308 = local_608;
        uStack_300 = uStack_600;
        local_268 = local_b88;
        uStack_260 = uStack_b80;
        local_28 = local_638;
        uStack_20 = uStack_630;
      }
    }
  }
  else {
    for (local_b8c = 0; local_b8c < local_b04; local_b8c = local_b8c + 1) {
      ncnn::Mat::channel(in_stack_fffffffffffff408,(int)((ulong)in_stack_fffffffffffff400 >> 0x20));
      pfVar12 = ncnn::Mat::operator_cast_to_float_(&local_be0);
      ncnn::Mat::~Mat((Mat *)0x903756);
      local_b98 = pfVar12;
      for (local_be4 = 0; local_be4 + 3 < local_b08; local_be4 = local_be4 + 4) {
        local_ad8 = local_b98;
        in_stack_fffffffffffff408 = *(Mat **)local_b98;
        uStack_a80 = *(undefined8 *)(local_b98 + 2);
        local_ab0 = local_b98;
        local_9cc = 0x3f800000;
        local_9e8 = 0x3f800000;
        local_a08 = 0x3f8000003f800000;
        uStack_a00 = 0x3f8000003f800000;
        local_228 = 0;
        uStack_220 = 0;
        local_278 = 0;
        uStack_270 = 0;
        local_288._0_4_ = SUB84(in_stack_fffffffffffff408,0);
        local_288._4_4_ = (float)((ulong)in_stack_fffffffffffff408 >> 0x20);
        uStack_280._0_4_ = (float)uStack_a80;
        uStack_280._4_4_ = (float)((ulong)uStack_a80 >> 0x20);
        local_8a8 = CONCAT44(0.0 - local_288._4_4_,0.0 - (float)local_288);
        uStack_8a0._0_4_ = 0.0 - (float)uStack_280;
        uStack_8a0._4_4_ = 0.0 - uStack_280._4_4_;
        local_238 = 0;
        uStack_230 = 0;
        local_8e8 = 0x3f8000003f800000;
        uStack_8e0 = 0x3f8000003f800000;
        local_1d8 = local_8a8;
        uStack_1d0 = uStack_8a0;
        local_1e8 = 0x42b0c0a542b0c0a5;
        uStack_1e0 = 0x42b0c0a542b0c0a5;
        auVar9._8_8_ = uStack_8a0;
        auVar9._0_8_ = local_8a8;
        auVar8._8_8_ = 0x42b0c0a542b0c0a5;
        auVar8._0_8_ = 0x42b0c0a542b0c0a5;
        auVar15 = minps(auVar9,auVar8);
        local_8a8 = auVar15._0_8_;
        local_198 = local_8a8;
        uStack_8a0 = auVar15._8_8_;
        uStack_190 = uStack_8a0;
        local_1a8 = 0xc2b0c0a5c2b0c0a5;
        uStack_1a0 = 0xc2b0c0a5c2b0c0a5;
        auVar11._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar11._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar15 = maxps(auVar15,auVar11);
        local_8a8 = auVar15._0_8_;
        uVar1 = local_8a8;
        uStack_8a0 = auVar15._8_8_;
        uVar2 = uStack_8a0;
        local_758 = 0x3fb8aa3b3fb8aa3b;
        uStack_750 = 0x3fb8aa3b3fb8aa3b;
        local_748._0_4_ = auVar15._0_4_;
        local_748._4_4_ = auVar15._4_4_;
        uStack_740._0_4_ = auVar15._8_4_;
        uStack_740._4_4_ = auVar15._12_4_;
        local_648 = CONCAT44(local_748._4_4_ * 1.442695,(float)local_748 * 1.442695);
        uStack_640 = CONCAT44(uStack_740._4_4_ * 1.442695,(float)uStack_740 * 1.442695);
        local_6f8 = 0x3f0000003f000000;
        uStack_6f0 = 0x3f0000003f000000;
        fVar16 = (float)local_748 * 1.442695 + 0.5;
        fVar17 = local_748._4_4_ * 1.442695 + 0.5;
        fVar18 = (float)uStack_740 * 1.442695 + 0.5;
        fVar19 = uStack_740._4_4_ * 1.442695 + 0.5;
        local_158 = CONCAT44(fVar17,fVar16);
        uStack_150 = CONCAT44(fVar19,fVar18);
        local_138 = CONCAT44((int)fVar17,(int)fVar16);
        uStack_130 = CONCAT44((int)fVar19,(int)fVar18);
        local_8c8 = (float)(int)fVar16;
        fStack_8c4 = (float)(int)fVar17;
        fStack_8c0 = (float)(int)fVar18;
        fStack_8bc = (float)(int)fVar19;
        local_8b8 = CONCAT44(fStack_8c4,local_8c8);
        uStack_8b0 = CONCAT44(fStack_8bc,fStack_8c0);
        local_f8 = local_8b8;
        uStack_f0 = uStack_8b0;
        local_108 = CONCAT44(fVar17,fVar16);
        uStack_100 = CONCAT44(fVar19,fVar18);
        local_8f8 = CONCAT44(-(uint)(fVar17 < fStack_8c4),-(uint)(fVar16 < local_8c8));
        uStack_8f0 = CONCAT44(-(uint)(fVar19 < fStack_8bc),-(uint)(fVar18 < fStack_8c0));
        local_b8 = local_8f8;
        uStack_b0 = uStack_8f0;
        local_c8 = 0x3f8000003f800000;
        uStack_c0 = 0x3f8000003f800000;
        local_8f8 = local_8f8 & 0x3f8000003f800000;
        uStack_8f0 = uStack_8f0 & 0x3f8000003f800000;
        local_298 = local_8b8;
        uStack_290 = uStack_8b0;
        local_2a8._0_4_ = (float)local_8f8;
        local_2a8._4_4_ = (float)(local_8f8 >> 0x20);
        uStack_2a0._0_4_ = (float)uStack_8f0;
        uStack_2a0._4_4_ = (float)(uStack_8f0 >> 0x20);
        local_8c8 = local_8c8 - (float)local_2a8;
        fStack_8c4 = fStack_8c4 - local_2a8._4_4_;
        fStack_8c0 = fStack_8c0 - (float)uStack_2a0;
        fStack_8bc = fStack_8bc - uStack_2a0._4_4_;
        local_768 = CONCAT44(fStack_8c4,local_8c8);
        uStack_760 = CONCAT44(fStack_8bc,fStack_8c0);
        local_778 = 0x3f3180003f318000;
        uStack_770 = 0x3f3180003f318000;
        local_8b8 = CONCAT44(fStack_8c4 * 0.6933594,local_8c8 * 0.6933594);
        uStack_8b0 = CONCAT44(fStack_8bc * 0.6933594,fStack_8c0 * 0.6933594);
        local_788 = CONCAT44(fStack_8c4,local_8c8);
        uStack_780 = CONCAT44(fStack_8bc,fStack_8c0);
        local_798 = 0xb95e8083b95e8083;
        uStack_790 = 0xb95e8083b95e8083;
        local_2b8 = local_8a8;
        uStack_2b0 = uStack_8a0;
        local_2c8 = local_8b8;
        uStack_2c0 = uStack_8b0;
        local_748._0_4_ = (float)local_748 - local_8c8 * 0.6933594;
        local_748._4_4_ = local_748._4_4_ - fStack_8c4 * 0.6933594;
        uStack_740._0_4_ = (float)uStack_740 - fStack_8c0 * 0.6933594;
        uStack_740._4_4_ = uStack_740._4_4_ - fStack_8bc * 0.6933594;
        local_8a8 = CONCAT44(local_748._4_4_,(float)local_748);
        uStack_8a0._0_4_ = (float)uStack_740;
        uStack_8a0._4_4_ = uStack_740._4_4_;
        local_2d8 = local_8a8;
        uStack_2d0 = uStack_8a0;
        local_2e8 = CONCAT44(fStack_8c4 * -0.00021219444,local_8c8 * -0.00021219444);
        uStack_2e0 = CONCAT44(fStack_8bc * -0.00021219444,fStack_8c0 * -0.00021219444);
        local_748._0_4_ = (float)local_748 - local_8c8 * -0.00021219444;
        local_748._4_4_ = local_748._4_4_ - fStack_8c4 * -0.00021219444;
        uStack_740._0_4_ = (float)uStack_740 - fStack_8c0 * -0.00021219444;
        uStack_740._4_4_ = uStack_740._4_4_ - fStack_8bc * -0.00021219444;
        local_8a8 = CONCAT44(local_748._4_4_,(float)local_748);
        uStack_8a0._0_4_ = (float)uStack_740;
        uStack_8a0._4_4_ = uStack_740._4_4_;
        local_7b8 = local_8a8;
        uStack_7b0 = uStack_8a0;
        local_908 = (float)local_748 * (float)local_748;
        fStack_904 = local_748._4_4_ * local_748._4_4_;
        fStack_900 = (float)uStack_740 * (float)uStack_740;
        fStack_8fc = uStack_740._4_4_ * uStack_740._4_4_;
        local_7c8 = 0x3950696739506967;
        uStack_7c0 = 0x3950696739506967;
        local_7d8 = local_8a8;
        uStack_7d0 = uStack_8a0;
        local_918 = CONCAT44(local_748._4_4_ * 0.00019875691,(float)local_748 * 0.00019875691);
        uStack_910 = CONCAT44(uStack_740._4_4_ * 0.00019875691,(float)uStack_740 * 0.00019875691);
        local_668 = local_918;
        uStack_660 = uStack_910;
        local_678 = 0x3ab743ce3ab743ce;
        uStack_670 = 0x3ab743ce3ab743ce;
        local_9a8 = (float)local_748 * 0.00019875691 + 0.0013981999;
        fStack_9a4 = local_748._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_9a0 = (float)uStack_740 * 0.00019875691 + 0.0013981999;
        fStack_99c = uStack_740._4_4_ * 0.00019875691 + 0.0013981999;
        local_918 = CONCAT44(fStack_9a4,local_9a8);
        uStack_910 = CONCAT44(fStack_99c,fStack_9a0);
        local_7e8 = local_918;
        uStack_7e0 = uStack_910;
        local_7f8 = local_8a8;
        uStack_7f0 = uStack_8a0;
        local_9a8 = local_9a8 * (float)local_748;
        fStack_9a4 = fStack_9a4 * local_748._4_4_;
        fStack_9a0 = fStack_9a0 * (float)uStack_740;
        fStack_99c = fStack_99c * uStack_740._4_4_;
        local_918 = CONCAT44(fStack_9a4,local_9a8);
        uStack_910 = CONCAT44(fStack_99c,fStack_9a0);
        local_688 = local_918;
        uStack_680 = uStack_910;
        local_698 = 0x3c0889083c088908;
        uStack_690 = 0x3c0889083c088908;
        local_9a8 = local_9a8 + 0.008333452;
        fStack_9a4 = fStack_9a4 + 0.008333452;
        fStack_9a0 = fStack_9a0 + 0.008333452;
        fStack_99c = fStack_99c + 0.008333452;
        local_918 = CONCAT44(fStack_9a4,local_9a8);
        uStack_910 = CONCAT44(fStack_99c,fStack_9a0);
        local_808 = local_918;
        uStack_800 = uStack_910;
        local_818 = local_8a8;
        uStack_810 = uStack_8a0;
        local_9a8 = local_9a8 * (float)local_748;
        fStack_9a4 = fStack_9a4 * local_748._4_4_;
        fStack_9a0 = fStack_9a0 * (float)uStack_740;
        fStack_99c = fStack_99c * uStack_740._4_4_;
        local_918 = CONCAT44(fStack_9a4,local_9a8);
        uStack_910 = CONCAT44(fStack_99c,fStack_9a0);
        local_6a8 = local_918;
        uStack_6a0 = uStack_910;
        local_6b8 = 0x3d2aa9c13d2aa9c1;
        uStack_6b0 = 0x3d2aa9c13d2aa9c1;
        local_9a8 = local_9a8 + 0.041665796;
        fStack_9a4 = fStack_9a4 + 0.041665796;
        fStack_9a0 = fStack_9a0 + 0.041665796;
        fStack_99c = fStack_99c + 0.041665796;
        local_918 = CONCAT44(fStack_9a4,local_9a8);
        uStack_910 = CONCAT44(fStack_99c,fStack_9a0);
        local_828 = local_918;
        uStack_820 = uStack_910;
        local_838 = local_8a8;
        uStack_830 = uStack_8a0;
        local_9a8 = local_9a8 * (float)local_748;
        fStack_9a4 = fStack_9a4 * local_748._4_4_;
        fStack_9a0 = fStack_9a0 * (float)uStack_740;
        fStack_99c = fStack_99c * uStack_740._4_4_;
        local_918 = CONCAT44(fStack_9a4,local_9a8);
        uStack_910 = CONCAT44(fStack_99c,fStack_9a0);
        local_6c8 = local_918;
        uStack_6c0 = uStack_910;
        local_6d8 = 0x3e2aaaaa3e2aaaaa;
        uStack_6d0 = 0x3e2aaaaa3e2aaaaa;
        local_9a8 = local_9a8 + 0.16666666;
        fStack_9a4 = fStack_9a4 + 0.16666666;
        fStack_9a0 = fStack_9a0 + 0.16666666;
        fStack_99c = fStack_99c + 0.16666666;
        local_918 = CONCAT44(fStack_9a4,local_9a8);
        uStack_910 = CONCAT44(fStack_99c,fStack_9a0);
        local_848 = local_918;
        uStack_840 = uStack_910;
        local_858 = local_8a8;
        uStack_850 = uStack_8a0;
        local_9a8 = local_9a8 * (float)local_748;
        fStack_9a4 = fStack_9a4 * local_748._4_4_;
        fStack_9a0 = fStack_9a0 * (float)uStack_740;
        fStack_99c = fStack_99c * uStack_740._4_4_;
        local_918 = CONCAT44(fStack_9a4,local_9a8);
        uStack_910 = CONCAT44(fStack_99c,fStack_9a0);
        local_6e8 = local_918;
        uStack_6e0 = uStack_910;
        local_9a8 = local_9a8 + 0.5;
        fStack_9a4 = fStack_9a4 + 0.5;
        fStack_9a0 = fStack_9a0 + 0.5;
        fStack_99c = fStack_99c + 0.5;
        local_918 = CONCAT44(fStack_9a4,local_9a8);
        uStack_910 = CONCAT44(fStack_99c,fStack_9a0);
        local_868 = local_918;
        uStack_860 = uStack_910;
        local_878 = CONCAT44(fStack_904,local_908);
        uStack_870 = CONCAT44(fStack_8fc,fStack_900);
        local_9a8 = local_9a8 * local_908;
        fStack_9a4 = fStack_9a4 * fStack_904;
        fStack_9a0 = fStack_9a0 * fStack_900;
        fStack_99c = fStack_99c * fStack_8fc;
        local_918 = CONCAT44(fStack_9a4,local_9a8);
        uStack_910 = CONCAT44(fStack_99c,fStack_9a0);
        local_708 = local_918;
        uStack_700 = uStack_910;
        local_718 = local_8a8;
        uStack_710 = uStack_8a0;
        local_9a8 = local_9a8 + (float)local_748;
        fStack_9a4 = fStack_9a4 + local_748._4_4_;
        fStack_9a0 = fStack_9a0 + (float)uStack_740;
        fStack_99c = fStack_99c + uStack_740._4_4_;
        local_918 = CONCAT44(fStack_9a4,local_9a8);
        uStack_910 = CONCAT44(fStack_99c,fStack_9a0);
        local_728 = local_918;
        uStack_720 = uStack_910;
        local_738 = 0x3f8000003f800000;
        uStack_730 = 0x3f8000003f800000;
        local_9a8 = local_9a8 + 1.0;
        fStack_9a4 = fStack_9a4 + 1.0;
        fStack_9a0 = fStack_9a0 + 1.0;
        fStack_99c = fStack_99c + 1.0;
        local_918 = CONCAT44(fStack_9a4,local_9a8);
        uStack_910 = CONCAT44(fStack_99c,fStack_9a0);
        local_168 = CONCAT44(fStack_8c4,local_8c8);
        uStack_160 = CONCAT44(fStack_8bc,fStack_8c0);
        local_78 = CONCAT44((int)fStack_8c4,(int)local_8c8);
        uStack_70 = CONCAT44((int)fStack_8bc,(int)fStack_8c0);
        local_88 = 0x7f0000007f;
        uStack_80 = 0x7f0000007f;
        iVar13 = (int)local_8c8 + 0x7f;
        fStack_8d4 = (float)((int)fStack_8c4 + 0x7f);
        fStack_8d0 = (float)((int)fStack_8c0 + 0x7f);
        fStack_8cc = (float)((int)fStack_8bc + 0x7f);
        local_38 = CONCAT44(fStack_8d4,iVar13);
        uStack_30 = CONCAT44(fStack_8cc,fStack_8d0);
        local_3c = 0x17;
        local_8d8 = (float)(iVar13 * 0x800000);
        local_928 = CONCAT44(fStack_8d4,local_8d8);
        uStack_920 = CONCAT44(fStack_8cc,fStack_8d0);
        local_888 = local_918;
        uStack_880 = uStack_910;
        local_9a8 = local_9a8 * local_8d8;
        fStack_9a4 = fStack_9a4 * fStack_8d4;
        fStack_9a0 = fStack_9a0 * fStack_8d0;
        fStack_99c = fStack_99c * fStack_8cc;
        local_918 = CONCAT44(fStack_9a4,local_9a8);
        uStack_910 = CONCAT44(fStack_99c,fStack_9a0);
        local_968 = local_918;
        uStack_960 = uStack_910;
        local_9a8 = local_9a8 + 1.0;
        fStack_9a4 = fStack_9a4 + 1.0;
        fStack_9a0 = fStack_9a0 + 1.0;
        fStack_99c = fStack_99c + 1.0;
        auVar3._8_8_ = 0x3f8000003f800000;
        auVar3._0_8_ = 0x3f8000003f800000;
        auVar15._4_4_ = fStack_9a4;
        auVar15._0_4_ = local_9a8;
        auVar15._8_4_ = fStack_9a0;
        auVar15._12_4_ = fStack_99c;
        _local_a48 = divps(auVar3,auVar15);
        local_ac8 = (float)local_288 * (float)local_a48._0_4_;
        fStack_ac4 = local_288._4_4_ * (float)local_a48._4_4_;
        fStack_ac0 = (float)uStack_280 * fStack_a40;
        fStack_abc = uStack_280._4_4_ * fStack_a3c;
        *(ulong *)local_b98 = CONCAT44(fStack_ac4,local_ac8);
        *(ulong *)(local_b98 + 2) = CONCAT44(fStack_abc,fStack_ac0);
        local_b98 = local_b98 + 4;
        local_a88 = in_stack_fffffffffffff408;
        local_a38 = in_stack_fffffffffffff408;
        uStack_a30 = uStack_a80;
        local_9f8 = in_stack_fffffffffffff408;
        uStack_9f0 = uStack_a80;
        uStack_9e4 = local_9e8;
        uStack_9e0 = local_9e8;
        uStack_9dc = local_9e8;
        local_998 = local_a08;
        uStack_990 = uStack_a00;
        local_958 = local_a08;
        uStack_950 = uStack_a00;
        local_898 = local_928;
        uStack_890 = uStack_920;
        local_7a8 = local_7b8;
        uStack_7a0 = uStack_7b0;
        local_748 = uVar1;
        uStack_740 = uVar2;
        local_658 = local_6f8;
        uStack_650 = uStack_6f0;
        local_2a8 = local_8f8;
        uStack_2a0 = uStack_8f0;
        local_288 = in_stack_fffffffffffff408;
        uStack_280 = uStack_a80;
        local_18 = local_928;
        uStack_10 = uStack_920;
      }
      for (; local_be4 < local_b08; local_be4 = local_be4 + 1) {
        fVar16 = *local_b98;
        dVar14 = std::exp((double)(ulong)(uint)-*local_b98);
        *local_b98 = fVar16 / (SUB84(dVar14,0) + 1.0);
        local_b98 = local_b98 + 1;
      }
    }
  }
  return 0;
}

Assistant:

int Swish_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, swish_avx(_p));
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, swish_sse(_p));
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, swish_avx(_p));
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _mm_storeu_ps(ptr, swish_sse(_p));
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr / (1.f + exp(-*ptr));
            ptr++;
        }
    }

    return 0;
}